

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreval.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  double dVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
  *this;
  const_reference pvVar6;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t sVar7;
  char *pcVar8;
  size_t j;
  ulong uVar9;
  ulong uVar10;
  int interactive_flag;
  int option_index;
  pointer local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  int local_12c;
  CustomOperator custom_operator;
  size_t n_arg;
  _func_int **local_88;
  string str;
  Expression expr;
  
  expr.m_expression._M_dataplus._M_p = (pointer)&expr.m_expression.field_2;
  expr.m_expression._M_string_length = 0;
  expr.m_expression.field_2._M_local_buf[0] = '\0';
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  interactive_flag = 0;
  expr.is_calculated = false;
  str.field_2._M_local_buf[0] = '\0';
  do {
    while( true ) {
      if (main::long_options == '\0') {
        iVar3 = __cxa_guard_acquire(&main::long_options);
        if (iVar3 != 0) {
          main::long_options[0].name = "interactive";
          main::long_options[0].has_arg = 0;
          main::long_options[0].flag = &interactive_flag;
          main::long_options[0].val = 1;
          main::long_options[1].name = (char *)0x0;
          main::long_options[1].has_arg = 0;
          main::long_options[1]._12_4_ = 0;
          main::long_options[1].flag = (int *)0x0;
          main::long_options[1].val = 0;
          main::long_options[1]._28_4_ = 0;
          __cxa_guard_release(&main::long_options);
        }
      }
      _option_index = _option_index & 0xffffffff00000000;
      iVar3 = getopt_long(argc,argv,"i:",main::long_options,&option_index);
      if (iVar3 != 0) break;
      if (main::long_options[option_index].flag == (int *)0x0) {
        printf("option %s",main::long_options[option_index].name);
        if (_optarg != (char *)0x0) {
          printf(" with arg %s");
        }
        putchar(10);
      }
    }
  } while (iVar3 == 0x3f);
  if (iVar3 == -1) {
    if (_optind < argc) {
      printf("non-option ARGV-elements: ");
      while( true ) {
        lVar5 = (long)_optind;
        if (argc <= _optind) break;
        _optind = _optind + 1;
        printf("%s ",argv[lVar5]);
      }
      putchar(10);
    }
    if (interactive_flag != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"(Enter \'h\' for help)");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    local_88 = (_func_int **)&PTR__CustomOperator_00114ce8;
    while( true ) {
      std::operator<<((ostream *)&std::cout,": ");
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&str);
      cVar1 = *str._M_dataplus._M_p;
      if (cVar1 == 'q') break;
      if (interactive_flag == 0 || cVar1 != '>') {
        if (cVar1 == '<' && interactive_flag != 0) {
          custom_operator.super_BaseSpecification._vptr_BaseSpecification =
               (_func_int **)&custom_operator.symbol._M_string_length;
          custom_operator.symbol._M_dataplus._M_p = (pointer)0x0;
          custom_operator.symbol._M_string_length =
               custom_operator.symbol._M_string_length & 0xffffffffffffff00;
          std::operator<<((ostream *)&std::cout," < Symbol: ");
          std::operator>>((istream *)&std::cin,(string *)&custom_operator);
          ExprEval::Operator::remove_custom_operator((string *)&custom_operator);
          std::operator<<((ostream *)&std::cout,"= = = = = = = = = = = = = =\n");
          std::istream::ignore();
LAB_00109eee:
          std::__cxx11::string::~string((string *)&custom_operator);
        }
        else if (cVar1 == '?' && interactive_flag != 0) {
          this = ExprEval::Operator::get_custom_table();
          for (uVar10 = 0;
              uVar10 < (ulong)(((long)(this->
                                      super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->
                                     super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                                     )._M_impl.super__Vector_impl_data._M_start) / 0x98);
              uVar10 = uVar10 + 1) {
            pvVar6 = std::
                     vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                     ::at(this,uVar10);
            ExprEval::Operator::CustomOperator::CustomOperator(&custom_operator,pvVar6);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&option_index,&custom_operator.variables);
            poVar4 = std::operator<<((ostream *)&std::cout,"\t- ");
            poVar4 = std::operator<<(poVar4,(string *)&custom_operator.symbol);
            std::operator<<(poVar4,"(");
            lVar5 = 0;
            for (uVar9 = 0; uVar9 < (ulong)((long)local_148 - (long)_option_index >> 5);
                uVar9 = uVar9 + 1) {
              std::operator<<((ostream *)&std::cout,(string *)(_option_index + lVar5));
              if (uVar9 < ((long)local_148 - (long)_option_index >> 5) - 1U) {
                std::operator<<((ostream *)&std::cout,", ");
              }
              lVar5 = lVar5 + 0x20;
            }
            poVar4 = std::operator<<((ostream *)&std::cout,") = ");
            poVar4 = std::operator<<(poVar4,(string *)&custom_operator.expression);
            std::endl<char,std::char_traits<char>>(poVar4);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&option_index);
            ExprEval::Operator::CustomOperator::~CustomOperator(&custom_operator);
          }
          std::operator<<((ostream *)&std::cout,"= = = = = = = = = = = = = =\n");
        }
        else {
          if (cVar1 == 's' && interactive_flag != 0) {
            custom_operator.super_BaseSpecification._vptr_BaseSpecification =
                 (_func_int **)&custom_operator.symbol._M_string_length;
            custom_operator.symbol._M_dataplus._M_p = (pointer)0x0;
            custom_operator.symbol._M_string_length =
                 (ulong)custom_operator.symbol._M_string_length._1_7_ << 8;
            std::operator<<((ostream *)&std::cout,"\t[w] File path(default: operators.spec): ");
            pcVar8 = (char *)&custom_operator;
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&std::cin,(string *)pcVar8);
            sVar7 = extraout_RDX;
            if (custom_operator.symbol._M_dataplus._M_p == (pointer)0x0) {
              pcVar8 = "operators.spec";
              std::__cxx11::string::assign((char *)&custom_operator);
              sVar7 = extraout_RDX_00;
            }
            ExprEval::Operator::BaseSpecification::write((int)&custom_operator,pcVar8,sVar7);
            std::operator<<((ostream *)&std::cout,"= = = = = = = = = = = = = =\n");
            goto LAB_00109eee;
          }
          if (cVar1 == 'l' && interactive_flag != 0) {
            custom_operator.super_BaseSpecification._vptr_BaseSpecification =
                 (_func_int **)&custom_operator.symbol._M_string_length;
            custom_operator.symbol._M_dataplus._M_p = (pointer)0x0;
            custom_operator.symbol._M_string_length =
                 (ulong)custom_operator.symbol._M_string_length._1_7_ << 8;
            std::operator<<((ostream *)&std::cout,"\t[r] File path(default: operators.spec): ");
            pcVar8 = (char *)&custom_operator;
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&std::cin,(string *)pcVar8);
            sVar7 = extraout_RDX_01;
            if (custom_operator.symbol._M_dataplus._M_p == (pointer)0x0) {
              pcVar8 = "operators.spec";
              std::__cxx11::string::assign((char *)&custom_operator);
              sVar7 = extraout_RDX_02;
            }
            ExprEval::Operator::BaseSpecification::read((int)&custom_operator,pcVar8,sVar7);
            std::operator<<((ostream *)&std::cout,"= = = = = = = = = = = = = =\n");
            goto LAB_00109eee;
          }
          if (cVar1 == 'h' && interactive_flag != 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "\t| Use \'>\' to add a new operator/function;");
            std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "\t| Use \'<\' to remove an operator/function;");
            std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "\t| Use \'?\' to list all the user-defined operators/functions;"
                                    );
            std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "\t| Use \'s\' to save all the user-defined operators/functions;"
                                    );
            std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "\t| Use \'l\' to load all the user-defined operators/functions;"
                                    );
            std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<((ostream *)&std::cout,"\t| Use \'q\' to quit.");
            std::endl<char,std::char_traits<char>>(poVar4);
            std::operator<<((ostream *)&std::cout,"= = = = = = = = = = = = = =\n");
          }
          else {
            std::operator<<((ostream *)&std::cout," = ");
            dVar2 = ExprEval::Expression::evaluate(&expr,&str);
            poVar4 = std::ostream::_M_insert<double>(dVar2);
            std::endl<char,std::char_traits<char>>(poVar4);
          }
        }
      }
      else {
        custom_operator.super_BaseSpecification._vptr_BaseSpecification = local_88;
        custom_operator.symbol._M_dataplus._M_p = (pointer)&custom_operator.symbol.field_2;
        custom_operator.symbol._M_string_length = 0;
        custom_operator.symbol.field_2._M_local_buf[0] = '\0';
        custom_operator.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        custom_operator.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        custom_operator.variables.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        custom_operator.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        custom_operator.variables.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        custom_operator.variables.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        custom_operator.expression._M_dataplus._M_p = (pointer)&custom_operator.expression.field_2;
        custom_operator.expression._M_string_length = 0;
        custom_operator.expression.field_2._M_local_buf[0] = '\0';
        custom_operator.result._M_dataplus._M_p = (pointer)&custom_operator.result.field_2;
        custom_operator.result._M_string_length = 0;
        custom_operator.result.field_2._M_local_buf[0] = '\0';
        std::operator<<((ostream *)&std::cout,"\t> Symbol: ");
        std::operator>>((istream *)&std::cin,(string *)&custom_operator.symbol);
        std::operator<<((ostream *)&std::cout,"\t> # Args: ");
        std::istream::_M_extract<unsigned_long>(&std::cin);
        uVar10 = 1;
        while (uVar10 <= n_arg) {
          poVar4 = std::operator<<((ostream *)&std::cout,"\t> Variable [");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::operator<<(poVar4,"]: ");
          local_148 = (pointer)0x0;
          local_140._M_local_buf[0] = '\0';
          _option_index = (pointer)&local_140;
          std::operator>>((istream *)&std::cin,(string *)&option_index);
          if ((_option_index + -1)[(long)local_148] == '_') {
            local_12c = (int)uVar10;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (&custom_operator.arg_positions,&local_12c);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&custom_operator.variables,(value_type *)&option_index);
            uVar10 = uVar10 + 1;
          }
          else {
            std::operator<<((ostream *)&std::cout,
                            " ! [Variable names should end with underscore(_)]\n");
          }
          std::__cxx11::string::~string((string *)&option_index);
        }
        std::operator<<((ostream *)&std::cout,"\t> Expression: ");
        std::operator>>((istream *)&std::cin,(string *)&custom_operator.expression);
        ExprEval::Operator::add_custom_operator(&custom_operator);
        std::operator<<((ostream *)&std::cout,"= = = = = = = = = = = = = =\n");
        std::istream::ignore();
        ExprEval::Operator::CustomOperator::~CustomOperator(&custom_operator);
      }
    }
  }
  else {
    if (iVar3 != 0x69) {
      abort();
    }
    std::operator<<((ostream *)&std::cout," = ");
    std::__cxx11::string::string((string *)&custom_operator,_optarg,(allocator *)&n_arg);
    dVar2 = ExprEval::Expression::evaluate(&expr,(string *)&custom_operator);
    poVar4 = std::ostream::_M_insert<double>(dVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&custom_operator);
  }
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::~string((string *)&expr);
  return 0;
}

Assistant:

int main(int argc, char** argv){
    ExprEval::Expression expr;
    string str;

    // ExprEval::Function f({"x", "y"}, "x*y/100");
    // ExprEval::Function g({"x[0]", "x[1]"}, f.get({"x[0]-x[1]", "80-x[1]"}) + "+x[0]*x[1]");

    // try
    // {
    //     cout << f.get({4, 50}) << " = " << f({4, 50}) << endl;
    //     cout << g.get({4, 50}) << " = " << g({4, 50}) << endl;

    //     g.set({"x"}, "3*x+2");
    //     cout << g.get({4}) << " = " << g({4}) << endl;
    // }
    // catch(const ExprEval::Engine::Exception& e)
    // {
    //     std::cerr << e.what() << '\n';
    // }

    int c;
    int interactive_flag = 0;

    while (1){
        static struct option long_options[] =
        {
            {"interactive",   no_argument,       &interactive_flag, 1},
            {0, 0, 0, 0}
        };
    
        /* getopt_long stores the option index here. */
        int option_index = 0;
        c = getopt_long(argc, argv, "i:", long_options, &option_index);

        /* Detect the end of the options. */
        if (c == -1)
            break;

        switch (c)
            {
            case 0:
            /* If this option set a flag, do nothing else now. */
                if (long_options[option_index].flag != 0)
                    break;
                printf ("option %s", long_options[option_index].name);
                if (optarg)
                    printf (" with arg %s", optarg);
                printf ("\n");
                break;

            case 'i':
                cout << " = " << expr.evaluate(string(optarg)) << endl;
                // puts ("option -i\n");
                return 0;

            case '?':
                /* getopt_long already printed an error message. */
                break;

            default:
                abort ();
            }
        }

    /* Print any remaining command line arguments (not options). */
    if (optind < argc)
    {
        printf ("non-option ARGV-elements: ");
        while (optind < argc)
            printf ("%s ", argv[optind++]);
        putchar ('\n');
    }

    if(interactive_flag){
        cout << "(Enter 'h' for help)" << endl;
    }

    while(1){
        cout<<": ";
        getline(cin, str);
        if(str[0] == 'q') break;
        else if(str[0] == '>' && interactive_flag){
            ExprEval::Operator::CustomOperator custom_operator;
            size_t n_arg;

            cout<<"\t> Symbol: ";
            cin>>custom_operator.symbol;
            cout<<"\t> # Args: ";
            cin>>n_arg;
            for(size_t i=1; i<=n_arg; ++i){
                cout<<"\t> Variable ["<<i<<"]: ";
                string arg;
                cin>>arg;
                if(arg.back() != '_'){
                    cout<<" ! [Variable names should end with underscore(_)]\n";
                    i -= 1;
                    continue;
                }
                custom_operator.arg_positions.push_back(i);
                custom_operator.variables.push_back(arg);
            }
            cout<<"\t> Expression: ";
            cin>>custom_operator.expression;

            ExprEval::Operator::add_custom_operator(custom_operator);
            cout<<"= = = = = = = = = = = = = =\n";
            cin.ignore();
            continue;
        } else if(str[0] == '<' && interactive_flag){
            string symbol;
            cout<<" < Symbol: ";
            cin>>symbol;
            ExprEval::Operator::remove_custom_operator(symbol);
            cout<<"= = = = = = = = = = = = = =\n";
            cin.ignore();
            continue;
        } else if(str[0] == '?' && interactive_flag){
            auto custom_table = ExprEval::Operator::get_custom_table();
            for(size_t i=0; i<custom_table->size(); ++i){
                auto custom_operator = custom_table->at(i);
                auto args = custom_operator.variables;

                cout<<"\t- "<<custom_operator.symbol<<"(";
                for(size_t j=0; j<args.size(); ++j){
                    cout<<args[j];
                    if(j < args.size()-1) cout<<", ";
                }
                cout<<") = "<<custom_operator.expression<<endl;
            }
            cout<<"= = = = = = = = = = = = = =\n";
            continue;
        } else if(str[0] == 's' && interactive_flag){
            string file_path;

            cout << "\t[w] File path(default: operators.spec): ";
            getline(cin, file_path);
            if(file_path.empty()) file_path = DEFAULT_SPECIFICATION_FILE_PATH;

            try
            {
                ExprEval::Operator::BaseSpecification::write(file_path);
            }
            catch(const std::exception& e)
            {
                std::cerr << e.what() << '\n';
            }
            cout<<"= = = = = = = = = = = = = =\n";
            continue;
        } else if(str[0] == 'l' && interactive_flag){
            string file_path;

            cout << "\t[r] File path(default: operators.spec): ";
            getline(cin, file_path);
            if(file_path.empty()) file_path = DEFAULT_SPECIFICATION_FILE_PATH;

            try
            {
                ExprEval::Operator::BaseSpecification::read(file_path);
            }
            catch(const std::exception& e)
            {
                std::cerr << e.what() << '\n';
            }
            cout<<"= = = = = = = = = = = = = =\n";
            continue;
        } else if(str[0] == 'h' && interactive_flag){
            cout << "\t| Use '>' to add a new operator/function;" << endl;
            cout << "\t| Use '<' to remove an operator/function;" << endl;
            cout << "\t| Use '?' to list all the user-defined operators/functions;" << endl;
            cout << "\t| Use 's' to save all the user-defined operators/functions;" << endl;
            cout << "\t| Use 'l' to load all the user-defined operators/functions;" << endl;
            cout << "\t| Use 'q' to quit." << endl;
            cout<<"= = = = = = = = = = = = = =\n";
            continue;
        }
        
        try
        {
            cout<<" = "<<expr.evaluate(str)<<endl;
        }
        catch(const ExprEval::Engine::Exception& e)
        {
            std::cerr << e.what() << '\n';
        }
    }

    return 0;
}